

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_6::TwoLevelIterator::status(TwoLevelIterator *this)

{
  Status SVar1;
  long in_RSI;
  long in_FS_OFFSET;
  Status local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  IteratorWrapper::status((IteratorWrapper *)&local_38);
  SVar1.state_ = local_38.state_;
  Status::~Status(&local_38);
  if ((Iterator *)SVar1.state_ == (Iterator *)0x0) {
    if (*(long *)(in_RSI + 0x70) != 0) {
      IteratorWrapper::status((IteratorWrapper *)&local_38);
      Status::~Status(&local_38);
      if ((Iterator *)local_38.state_ != (Iterator *)0x0) goto LAB_0054563c;
    }
    Status::Status((Status *)this,(Status *)(in_RSI + 0x48));
  }
  else {
LAB_0054563c:
    IteratorWrapper::status((IteratorWrapper *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }